

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_https.hpp
# Opt level: O3

void __thiscall
SimpleWeb::Server<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Server
          (Server<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this,
          string *cert_file,string *private_key_file,string *verify_file)

{
  context *this_00;
  SSL_CTX *ctx;
  int iVar1;
  ulong uVar2;
  undefined4 extraout_var;
  error_code __ec;
  system_error e;
  system_error asStack_48 [32];
  
  ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::ServerBase
            (&this->super_ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,
             0x1bb);
  (this->super_ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>).
  _vptr_ServerBase = (_func_int **)&PTR__Server_001a8160;
  this->set_session_id_context = false;
  this_00 = &this->context;
  asio::ssl::context::context(this_00,tlsv12);
  asio::ssl::context::use_certificate_chain_file(this_00,cert_file);
  ERR_clear_error();
  iVar1 = SSL_CTX_use_PrivateKey_file
                    ((SSL_CTX *)this_00->handle_,(private_key_file->_M_dataplus)._M_p,1);
  if (iVar1 != 1) {
    uVar2 = ERR_get_error();
    if (asio::error::get_ssl_category()::instance == '\0') {
      SimpleWeb::Server();
    }
    if ((int)uVar2 != 0) {
      __ec._0_8_ = uVar2 & 0xffffffff;
      __ec._M_cat = (error_category *)&asio::error::get_ssl_category()::instance;
      std::system_error::system_error(asStack_48,__ec,"use_private_key_file");
      boost::throw_exception<std::system_error>(asStack_48);
    }
  }
  if (verify_file->_M_string_length != 0) {
    asio::ssl::context::load_verify_file(this_00,verify_file);
    ctx = (SSL_CTX *)this_00->handle_;
    iVar1 = SSL_CTX_get_verify_callback((int)ctx,(X509_STORE_CTX *)verify_file);
    SSL_CTX_set_verify(ctx,7,(callback *)CONCAT44(extraout_var,iVar1));
    this->set_session_id_context = true;
  }
  return;
}

Assistant:

Server(const std::string &cert_file, const std::string &private_key_file, const std::string &verify_file = std::string())
        : ServerBase<HTTPS>::ServerBase(443), context(asio::ssl::context::tlsv12) {
      context.use_certificate_chain_file(cert_file);
      context.use_private_key_file(private_key_file, asio::ssl::context::pem);

      if(verify_file.size() > 0) {
        context.load_verify_file(verify_file);
        context.set_verify_mode(asio::ssl::verify_peer | asio::ssl::verify_fail_if_no_peer_cert | asio::ssl::verify_client_once);
        set_session_id_context = true;
      }
    }